

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int ExportAlpha(WebPDecParams *p,int y_pos,int max_lines_out)

{
  WEBP_CSP_MODE mode;
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint8_t *puVar5;
  int iVar6;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int width;
  uint32_t non_opaque;
  int is_premult_alpha;
  int num_lines_out;
  uint8_t *dst;
  int alpha_first;
  WEBP_CSP_MODE colorspace;
  uint8_t *base_rgba;
  WebPRGBABuffer *buf;
  bool local_41;
  uint uVar7;
  int local_34;
  uint8_t *local_30;
  
  lVar1 = *in_RDI;
  puVar5 = (uint8_t *)(*(long *)(lVar1 + 0x10) + (long)in_ESI * (long)*(int *)(lVar1 + 0x18));
  mode = *(WEBP_CSP_MODE *)*in_RDI;
  local_41 = mode == MODE_ARGB || mode == MODE_Argb;
  iVar6 = 3;
  if (local_41 != 0) {
    iVar6 = 0;
  }
  local_30 = puVar5 + iVar6;
  local_34 = 0;
  iVar2 = WebPIsPremultipliedMode(mode);
  uVar7 = 0;
  iVar6 = *(int *)(in_RDI[9] + 0x34);
  for (; iVar3 = WebPRescalerHasPendingOutput((WebPRescaler *)CONCAT44(uVar7,iVar6)),
      iVar3 != 0 && local_34 < in_EDX; local_34 = local_34 + 1) {
    WebPRescalerExportRow((WebPRescaler *)CONCAT44(uVar7,iVar6));
    uVar4 = (*WebPDispatchAlpha)(*(uint8_t **)(in_RDI[9] + 0x48),0,iVar6,1,local_30,0);
    uVar7 = uVar4 | uVar7;
    local_30 = local_30 + *(int *)(lVar1 + 0x18);
  }
  if ((iVar2 != 0) && (uVar7 != 0)) {
    (*WebPApplyAlphaMultiply)(puVar5,(uint)local_41,iVar6,local_34,*(int *)(lVar1 + 0x18));
  }
  return local_34;
}

Assistant:

static int ExportAlpha(WebPDecParams* const p, int y_pos, int max_lines_out) {
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* const base_rgba = buf->rgba + (size_t)y_pos * buf->stride;
  const WEBP_CSP_MODE colorspace = p->output->colorspace;
  const int alpha_first =
      (colorspace == MODE_ARGB || colorspace == MODE_Argb);
  uint8_t* dst = base_rgba + (alpha_first ? 0 : 3);
  int num_lines_out = 0;
  const int is_premult_alpha = WebPIsPremultipliedMode(colorspace);
  uint32_t non_opaque = 0;
  const int width = p->scaler_a->dst_width;

  while (WebPRescalerHasPendingOutput(p->scaler_a) &&
         num_lines_out < max_lines_out) {
    assert(y_pos + num_lines_out < p->output->height);
    WebPRescalerExportRow(p->scaler_a);
    non_opaque |= WebPDispatchAlpha(p->scaler_a->dst, 0, width, 1, dst, 0);
    dst += buf->stride;
    ++num_lines_out;
  }
  if (is_premult_alpha && non_opaque) {
    WebPApplyAlphaMultiply(base_rgba, alpha_first,
                           width, num_lines_out, buf->stride);
  }
  return num_lines_out;
}